

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

bool __thiscall
FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>
::hasFastAccess(FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<Fad<double>_>_>_>_>_>
                *this)

{
  if ((((((((this->left_->fadexpr_).left_)->fadexpr_).right_)->fadexpr_).expr_.dx_.num_elts != 0) &&
      ((((this->left_->fadexpr_).right_)->fadexpr_).expr_.dx_.num_elts != 0)) &&
     ((((((this->right_->fadexpr_).left_)->fadexpr_).right_)->fadexpr_).expr_.dx_.num_elts != 0)) {
    return (((this->right_->fadexpr_).right_)->fadexpr_).expr_.dx_.num_elts != 0;
  }
  return false;
}

Assistant:

bool hasFastAccess() const { return left_.hasFastAccess() && right_.hasFastAccess();}